

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SPIRConstantOp * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::allocate<spirv_cross::SPIRConstantOp&>
          (ObjectPool<spirv_cross::SPIRConstantOp> *this,SPIRConstantOp *p)

{
  Vector<spirv_cross::SPIRConstantOp_*> *this_00;
  undefined4 uVar1;
  _Tuple_impl<0UL,_spirv_cross::SPIRConstantOp_*,_spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::MallocDeleter>
  _Var2;
  _Head_base<0UL,_spirv_cross::SPIRConstantOp_*,_false> _Var3;
  size_t sVar4;
  ulong uVar5;
  SPIRConstantOp *pSVar6;
  
  this_00 = &this->vacants;
  sVar4 = (this->vacants).super_VectorView<spirv_cross::SPIRConstantOp_*>.buffer_size;
  if (sVar4 == 0) {
    sVar4 = (this->memory).
            super_VectorView<std::unique_ptr<spirv_cross::SPIRConstantOp,_spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::MallocDeleter>_>
            .buffer_size;
    uVar5 = (ulong)(this->start_object_count << ((byte)sVar4 & 0x1f));
    _Var2.super__Head_base<0UL,_spirv_cross::SPIRConstantOp_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRConstantOp_*,_false>)malloc(uVar5 * 0x50);
    if (_Var2.super__Head_base<0UL,_spirv_cross::SPIRConstantOp_*,_false>._M_head_impl ==
        (SPIRConstantOp *)0x0) {
      return (SPIRConstantOp *)0x0;
    }
    if (uVar5 != 0) {
      sVar4 = 0;
      _Var3._M_head_impl =
           (SPIRConstantOp *)
           _Var2.super__Head_base<0UL,_spirv_cross::SPIRConstantOp_*,_false>._M_head_impl;
      do {
        SmallVector<spirv_cross::SPIRConstantOp_*,_0UL>::reserve(this_00,sVar4 + 1);
        sVar4 = (this->vacants).super_VectorView<spirv_cross::SPIRConstantOp_*>.buffer_size;
        (this->vacants).super_VectorView<spirv_cross::SPIRConstantOp_*>.ptr[sVar4] =
             _Var3._M_head_impl;
        sVar4 = sVar4 + 1;
        (this->vacants).super_VectorView<spirv_cross::SPIRConstantOp_*>.buffer_size = sVar4;
        _Var3._M_head_impl = _Var3._M_head_impl + 1;
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
      sVar4 = (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRConstantOp,_spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::MallocDeleter>_>
              .buffer_size;
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRConstantOp,_spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::MallocDeleter>,_8UL>
    ::reserve(&this->memory,sVar4 + 1);
    sVar4 = (this->memory).
            super_VectorView<std::unique_ptr<spirv_cross::SPIRConstantOp,_spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::MallocDeleter>_>
            .buffer_size;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRConstantOp,_spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::MallocDeleter>_>
    .ptr[sVar4]._M_t.
    super___uniq_ptr_impl<spirv_cross::SPIRConstantOp,_spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::MallocDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_spirv_cross::SPIRConstantOp_*,_spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::MallocDeleter>
    .super__Head_base<0UL,_spirv_cross::SPIRConstantOp_*,_false> =
         _Var2.super__Head_base<0UL,_spirv_cross::SPIRConstantOp_*,_false>._M_head_impl;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRConstantOp,_spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::MallocDeleter>_>
    .buffer_size = sVar4 + 1;
    sVar4 = (this->vacants).super_VectorView<spirv_cross::SPIRConstantOp_*>.buffer_size;
    pSVar6 = (this->vacants).super_VectorView<spirv_cross::SPIRConstantOp_*>.ptr[sVar4 - 1];
    if (sVar4 == 0) goto LAB_002ccb32;
  }
  else {
    pSVar6 = (this_00->super_VectorView<spirv_cross::SPIRConstantOp_*>).ptr[sVar4 - 1];
  }
  SmallVector<spirv_cross::SPIRConstantOp_*,_0UL>::resize(this_00,sVar4 - 1);
LAB_002ccb32:
  (pSVar6->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRConstantOp_00358a10;
  uVar1 = *(undefined4 *)&(p->super_IVariant).field_0xc;
  (pSVar6->super_IVariant).self = (ID)(p->super_IVariant).self.id;
  *(undefined4 *)&(pSVar6->super_IVariant).field_0xc = uVar1;
  (pSVar6->arguments).super_VectorView<unsigned_int>.buffer_size = 0;
  (pSVar6->arguments).super_VectorView<unsigned_int>.ptr =
       (uint *)&(pSVar6->arguments).stack_storage;
  (pSVar6->arguments).buffer_capacity = 8;
  SmallVector<unsigned_int,_8UL>::operator=(&pSVar6->arguments,&p->arguments);
  (pSVar6->basetype).id = (p->basetype).id;
  return pSVar6;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}